

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall JetHead::vector<Timer_*>::sizeup(vector<Timer_*> *this,uint newSize)

{
  uint uVar1;
  Timer **p;
  Timer **ppTVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0x20;
  if (this->mAllocated != 0) {
    uVar4 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar4 = (ulong)newSize;
  }
  ppTVar2 = (Timer **)operator_new__(uVar4 * 8);
  p = this->mData;
  if (p != (Timer **)0x0) {
    uVar1 = this->mSize;
    if ((ulong)uVar1 != 0) {
      uVar3 = 0;
      do {
        ppTVar2[uVar3] = p[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    operator_delete__(p);
  }
  this->mData = ppTVar2;
  this->mAllocated = (uint)uVar4;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}